

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_delimit_enum_flags(flatcc_json_printer_t *ctx,int multiple)

{
  uint8_t uVar1;
  
  uVar1 = ctx->unquote;
  *ctx->p = '\"';
  ctx->p = ctx->p + (multiple != 0 || uVar1 == '\0');
  return;
}

Assistant:

void flatcc_json_printer_delimit_enum_flags(flatcc_json_printer_t *ctx, int multiple)
{
#if FLATCC_JSON_PRINT_ALWAYS_QUOTE_MULTIPLE_FLAGS
    int quote = !ctx->unquote || multiple;
#else
    int quote = !ctx->unquote;
#endif
    *ctx->p = '"';
    ctx->p += quote;
}